

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::setGroupSeparatorShown(QAbstractSpinBox *this,bool shown)

{
  QAbstractSpinBoxPrivate *this_00;
  
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  if (((*(uint *)&this_00->field_0x3d0 >> 9 & 1) == 0) != shown) {
    return;
  }
  *(ushort *)&this_00->field_0x3d0 =
       (ushort)*(uint *)&this_00->field_0x3d0 & 0xfdff | (ushort)shown << 9;
  QAbstractSpinBoxPrivate::setValue(this_00,&this_00->value,EmitIfChanged,true);
  QWidget::updateGeometry((QWidget *)this);
  return;
}

Assistant:

void QAbstractSpinBox::setGroupSeparatorShown(bool shown)
{
    Q_D(QAbstractSpinBox);
    if (d->showGroupSeparator == shown)
        return;
    d->showGroupSeparator = shown;
    d->setValue(d->value, EmitIfChanged);
    updateGeometry();
}